

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

bool __thiscall
Js::FunctionBody::MapEntryPointsUntil<Js::FunctionBody::DoRedeferFunction(unsigned_int)const::__0>
          (FunctionBody *this,anon_class_1_1_c2969d66 fn)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  **ppSVar1;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  FunctionBody *this_local;
  anon_class_1_1_c2969d66 fn_local;
  
  this_local._6_1_ = fn.isJitModeFunction;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SynchronizableList__
                      ((WriteBarrierPtr *)&this->entryPoints);
  if (*ppSVar1 ==
      (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = Memory::
              WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
              ::operator->(&this->entryPoints);
    this_local._7_1_ =
         SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
         ::
         MapUntil<Js::FunctionBody::MapEntryPointsUntil<Js::FunctionBody::DoRedeferFunction(unsigned_int)const::__0>(Js::FunctionBody::DoRedeferFunction(unsigned_int)const::__0)const::_lambda(int,Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*)_1_>
                   ((SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
                     *)this_00,(anon_class_1_1_c2969d66 *)((long)&this_local + 6));
  }
  return this_local._7_1_;
}

Assistant:

bool MapEntryPointsUntil(Fn fn) const
        {
            if (this->entryPoints)
            {
                return this->entryPoints->MapUntil([&fn](int index, RecyclerWeakReference<FunctionEntryPointInfo>* entryPoint) {
                    FunctionEntryPointInfo* strongRef = entryPoint->Get();
                    if (strongRef)
                    {
                        return fn(index, strongRef);
                    }
                    return false;
                });
            }
            return false;
        }